

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O2

size_t __thiscall
GrcManager::OutputCmap31Table
          (GrcManager *this,void *pCmapSubTblSrc,GrcBinaryStream *pbstrm,bool fFrom310,
          bool *pfNeed310)

{
  undefined1 *os;
  utf16 uVar1;
  utf16 uVar2;
  uint nUnicodeId;
  long lVar3;
  offset_t lPos;
  offset_t lPos_00;
  long lVar4;
  undefined7 in_register_00000009;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint16_t x;
  ulong uVar8;
  ulong uVar9;
  short sVar10;
  int ich;
  ulong uVar11;
  int cch;
  int key;
  allocator aStack_200bd;
  uint uStack_200bc;
  ulong uStack_200b8;
  int nLog;
  int nPowerOf2;
  vector<int,_std::allocator<int>_> vichGroupStart;
  string sStack_20058;
  utf16 rgchChars [65535];
  
  os = &(pbstrm->super_fstream).field_0x10;
  lVar3 = std::ostream::tellp();
  cch = 0;
  GrcBinaryStream::write_16bits_be((ostream *)os,4);
  lPos = std::ostream::tellp();
  GrcBinaryStream::write_16bits_be((ostream *)os,0);
  GrcBinaryStream::write_16bits_be((ostream *)os,0);
  lPos_00 = std::ostream::tellp();
  GrcBinaryStream::write_16bits_be((ostream *)os,0);
  GrcBinaryStream::write_16bits_be((ostream *)os,0);
  GrcBinaryStream::write_16bits_be((ostream *)os,0);
  GrcBinaryStream::write_16bits_be((ostream *)os,0);
  vichGroupStart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vichGroupStart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vichGroupStart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  key = 0;
  if ((int)CONCAT71(in_register_00000009,fFrom310) == 0) {
    nUnicodeId = TtfUtil::Cmap31NextCodepoint(pCmapSubTblSrc,0,&key);
  }
  else {
    nUnicodeId = TtfUtil::Cmap310NextCodepoint(pCmapSubTblSrc,0,&key);
  }
  uStack_200bc = 0;
  uVar7 = 0;
  while ((int)nUnicodeId < 0xffff) {
    lVar4 = (long)cch;
    rgchChars[lVar4] = (utf16)nUnicodeId;
    if ((lVar4 == 0) || (nUnicodeId != rgchChars[lVar4 + -1] + 1)) {
      std::vector<int,_std::allocator<int>_>::push_back(&vichGroupStart,&cch);
      uVar7 = uVar7 + 1;
    }
    cch = cch + 1;
    if (fFrom310) {
      nUnicodeId = TtfUtil::Cmap310NextCodepoint(pCmapSubTblSrc,nUnicodeId,&key);
    }
    else {
      nUnicodeId = TtfUtil::Cmap31NextCodepoint(pCmapSubTblSrc,nUnicodeId,&key);
    }
    if (0xfff4 < (int)(cch * 2 + uVar7 * 8 + 0xe)) {
      cch = cch + -1;
      if (vichGroupStart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(long)(int)uVar7 + -1] == cch) {
        uVar7 = uVar7 - 1;
        vichGroupStart.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = vichGroupStart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
      }
      uStack_200bc = (uint)CONCAT71((uint7)(uint3)((uint)cch >> 8),1);
      nUnicodeId = 0xffff;
    }
  }
  rgchChars[cch] = 0xffff;
  std::vector<int,_std::allocator<int>_>::push_back(&vichGroupStart,&cch);
  uStack_200b8 = (ulong)(uVar7 + 1);
  cch = cch + 1;
  uVar8 = 0;
  uVar11 = 0;
  if (0 < (int)uVar7) {
    uVar11 = (ulong)uVar7;
  }
  for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
    GrcBinaryStream::write_16bits_be
              ((ostream *)os,
               rgchChars[(long)vichGroupStart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar8 + 1] + -1]);
  }
  GrcBinaryStream::write_16bits_be((ostream *)os,0xffff);
  GrcBinaryStream::write_16bits_be((ostream *)os,0);
  for (lVar4 = 0; lVar4 <= (int)uVar7; lVar4 = lVar4 + 1) {
    GrcBinaryStream::write_16bits_be
              ((ostream *)os,
               rgchChars[vichGroupStart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar4]]);
  }
  for (iVar6 = 0; iVar6 <= (int)uVar7; iVar6 = iVar6 + 1) {
    GrcBinaryStream::write_16bits_be((ostream *)os,0);
  }
  sVar10 = 0;
  uVar8 = uStack_200b8;
  for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
    uVar1 = rgchChars[vichGroupStart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9]];
    uVar2 = rgchChars[(long)vichGroupStart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar9 + 1] + -1];
    GrcBinaryStream::write_16bits_be((ostream *)os,((short)uVar8 + sVar10) * 2);
    sVar10 = (sVar10 - uVar1) + uVar2 + 1;
    uVar8 = (ulong)((int)uVar8 - 1);
  }
  GrcBinaryStream::write_16bits_be((ostream *)os,sVar10 * 2 + 2);
  for (lVar4 = 0; lVar4 < cch; lVar4 = lVar4 + 1) {
    x = (ushort)(rgchChars[lVar4] != 0xffff) * 3;
    if (rgchChars[lVar4] == 0x20) {
      x = 2;
    }
    GrcBinaryStream::write_16bits_be((ostream *)os,x);
  }
  lVar4 = std::ostream::tellp();
  GrcBinaryStream::SetPosition(pbstrm,lPos);
  GrcBinaryStream::write_16bits_be((ostream *)os,(uint16_t)(lVar4 - lVar3));
  BinarySearchConstants((int)uStack_200b8,&nPowerOf2,&nLog);
  GrcBinaryStream::SetPosition(pbstrm,lPos_00);
  GrcBinaryStream::write_16bits_be((ostream *)os,(short)uStack_200b8 * 2);
  GrcBinaryStream::write_16bits_be((ostream *)os,(short)nPowerOf2 * 2);
  GrcBinaryStream::write_16bits_be((ostream *)os,(uint16_t)nLog);
  GrcBinaryStream::write_16bits_be((ostream *)os,((short)uStack_200b8 - (short)nPowerOf2) * 2);
  GrcBinaryStream::SetPosition(pbstrm,lVar4);
  bVar5 = SUB41(uStack_200bc,0);
  if ((uStack_200bc & 1) != 0) {
    std::__cxx11::string::string
              ((string *)&sStack_20058,
               "cmap format 4 subtable truncated--does not match format 12 subtable",&aStack_200bd);
    GrcErrorList::AddWarning(&g_errorList,0x157e,(GdlObject *)0x0,&sStack_20058);
    std::__cxx11::string::~string((string *)&sStack_20058);
  }
  *pfNeed310 = bVar5;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vichGroupStart.super__Vector_base<int,_std::allocator<int>_>);
  return lVar4 - lVar3;
}

Assistant:

size_t GrcManager::OutputCmap31Table(void * pCmapSubTblSrc,
	GrcBinaryStream * pbstrm, bool fFrom310, bool * pfNeed310)
{
	auto lPosStart = pbstrm->Position();

	int cch = 0;	// number of codepoints in the map

	//	format
	pbstrm->WriteShort(4);

	//	length: fill in later
	auto lPosLen = pbstrm->Position();
	pbstrm->WriteShort(0);

	//	language (irrelevant except on Macintosh)
	pbstrm->WriteShort(0);

	//	search variables: fill in later
	auto lPosSearch = pbstrm->Position();
	pbstrm->WriteShort(0);
	pbstrm->WriteShort(0);
	pbstrm->WriteShort(0);
	pbstrm->WriteShort(0);

	//	Generate the list of supported characters.

	utf16 rgchChars[65535];
	std::vector<int> vichGroupStart;
	//std::vector<int> vcchGroupSize;
	int cGroups = 0;
	bool fTruncated = false;
	int key = 0; // for optimizing next-codepoint lookup
	int ch = (fFrom310) ?
		TtfUtil::Cmap310NextCodepoint(pCmapSubTblSrc, 0, &key) :
		TtfUtil::Cmap31NextCodepoint(pCmapSubTblSrc, 0, &key);
	while (ch < 0xFFFF)
	{
		rgchChars[cch] = ch;
		if (cch == 0 || ch != rgchChars[cch - 1] + 1)
		{
			vichGroupStart.push_back(cch);
			cGroups++;
		}

		cch++;
		ch = (fFrom310) ?
			TtfUtil::Cmap310NextCodepoint(pCmapSubTblSrc, ch, &key) :
			TtfUtil::Cmap31NextCodepoint(pCmapSubTblSrc, ch, &key);

		// If we're over the limit of what the subtable can handle, truncate.
		int cbNeeded = 14	// header
			+ (cGroups * 8)	// group information
			+ (cch * 2)		// glyphIdArray
			+ 10;			// final FFFF
		if (cbNeeded >= 0xFFFF) // 65535 is limit on subtable length
		{
			if (vichGroupStart[cGroups - 1] == cch - 1)
			{
				vichGroupStart.pop_back();
				cGroups--;
			}
			cch--;
			ch = 0xFFFF;
			fTruncated = true;
		}
	}
	rgchChars[cch] = 0xFFFF;  // this must always be last
	vichGroupStart.push_back(cch);
	cGroups++;
	cch++;

	//	Output the ranges of characters.

	//	End codes
	int iGroup;
	for (iGroup = 0; iGroup < cGroups - 1; iGroup++)
		pbstrm->WriteShort(rgchChars[vichGroupStart[iGroup+1] - 1]);
	pbstrm->WriteShort(0xFFFF);

	//	reserved pad
	pbstrm->WriteShort(0);

	//	Start codes
	for (iGroup = 0; iGroup < cGroups; iGroup++)
		pbstrm->WriteShort(rgchChars[vichGroupStart[iGroup]]);

	//	id delta: not used; pad with zeros
	for (iGroup = 0; iGroup < cGroups; iGroup++)
		pbstrm->WriteShort(0);

	//	id range array: each element holds the offset (in bytes) from the element
	//	itself down to the corresponding glyphIdArray element (this works because
	//	glyphIdArray immediately follows idRangeArray).
	int cchSoFar = 0;
	for (iGroup = 0; iGroup < cGroups - 1; iGroup++)
	{
		int nStart = rgchChars[vichGroupStart[iGroup]];
		int nEnd = rgchChars[vichGroupStart[iGroup+1] - 1];

		int nRangeOffset = (cGroups - iGroup + cchSoFar) * 2; // *2 for bytes, not wchars
		pbstrm->WriteShort(nRangeOffset);

		cchSoFar += (nEnd - nStart + 1);
	}
	pbstrm->WriteShort((1 + cchSoFar) * 2);
	cchSoFar++;

	//	glyphIdArray: all characters point to our special square box,
	//	except for the space character.
	for (int ich = 0; ich < cch; ich++)
	{
		if (rgchChars[ich] == kchwSpace)
			pbstrm->WriteShort(2);
		else if (rgchChars[ich] == 0xFFFF) // invalid
			pbstrm->WriteShort(0);
		else
			pbstrm->WriteShort(3);
	}

	auto lPosEnd = pbstrm->Position();

	//	Fill in the length.
	size_t cb = size_t(lPosEnd - lPosStart);
	pbstrm->SetPosition(lPosLen);
	pbstrm->WriteShort(cb);

	//	Fill in the search variables; note that these are byte-based and so are multiplied by 2,
	//	unlike what is done in the Graphite tables.
	int nPowerOf2, nLog;
	BinarySearchConstants(cGroups, &nPowerOf2, &nLog);
	pbstrm->SetPosition(lPosSearch);
	pbstrm->WriteShort(cGroups << 1);	// * 2
	pbstrm->WriteShort(nPowerOf2 << 1); // * 2
	pbstrm->WriteShort(nLog);
	pbstrm->WriteShort((cGroups - nPowerOf2) << 1);  // * 2

	pbstrm->SetPosition(lPosEnd);

	if (fTruncated)
	{
		g_errorList.AddWarning(5502, NULL,
			"cmap format 4 subtable truncated--does not match format 12 subtable");
	}

	*pfNeed310 = fTruncated;

	return cb;
}